

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O1

bool getVariableKktFailures
               (double primal_feasibility_tolerance,double dual_feasibility_tolerance,double lower,
               double upper,double value,double dual,HighsBasisStatus *status_pointer,
               HighsVarType integrality,double *absolute_primal_infeasibility,
               double *relative_primal_infeasibility,double *dual_infeasibility,
               double *value_residual)

{
  HighsBasisStatus HVar1;
  byte bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  
  *absolute_primal_infeasibility = 0.0;
  *relative_primal_infeasibility = 0.0;
  if (lower - primal_feasibility_tolerance <= value) {
    if (value <= primal_feasibility_tolerance + upper) goto LAB_0025933c;
    dVar4 = value - upper;
    dVar5 = upper;
  }
  else {
    dVar4 = lower - value;
    dVar5 = lower;
  }
  *absolute_primal_infeasibility = dVar4;
  *relative_primal_infeasibility = dVar4 / (ABS(dVar5) + 1.0);
LAB_0025933c:
  if (((ABS(value) < primal_feasibility_tolerance) && ((integrality & ~kInteger) == kSemiContinuous)
      ) && (0.0 < *absolute_primal_infeasibility)) {
    *absolute_primal_infeasibility = 0.0;
    *relative_primal_infeasibility = 0.0;
  }
  dVar4 = ABS(upper - value);
  if (ABS(lower - value) <= ABS(upper - value)) {
    dVar4 = ABS(lower - value);
  }
  bVar3 = dVar4 <= primal_feasibility_tolerance;
  *value_residual = dVar4;
  bVar2 = 1;
  if (status_pointer != (HighsBasisStatus *)0x0) {
    HVar1 = *status_pointer;
    bVar3 = HVar1 != kBasic && bVar3;
    if (HVar1 == kUpper) {
      if (ABS(upper) / primal_feasibility_tolerance < 1e-16) {
        bVar2 = -(upper - primal_feasibility_tolerance <= value) &
                -(value <= primal_feasibility_tolerance + upper);
      }
    }
    else if ((HVar1 == kLower) && (ABS(lower) / primal_feasibility_tolerance < 1e-16)) {
      bVar2 = -(value <= primal_feasibility_tolerance + lower) &
              -(lower - primal_feasibility_tolerance <= value);
    }
  }
  if (bVar3) {
    dVar4 = 0.0;
    if (lower < upper) {
      if (value < (lower + upper) * 0.5) {
        dual = -dual;
      }
      if (0.0 <= dual) {
        dVar4 = dual;
      }
    }
  }
  else {
    dVar4 = ABS(dual);
  }
  *dual_infeasibility = dVar4;
  return (bool)(bVar2 & 1);
}

Assistant:

bool getVariableKktFailures(const double primal_feasibility_tolerance,
                            const double dual_feasibility_tolerance,
                            const double lower, const double upper,
                            const double value, const double dual,
                            const HighsBasisStatus* status_pointer,
                            const HighsVarType integrality,
                            double& absolute_primal_infeasibility,
                            double& relative_primal_infeasibility,
                            double& dual_infeasibility,
                            double& value_residual) {
  bool status_value_ok = true;
  // @primal_infeasibility calculation
  absolute_primal_infeasibility = 0;
  relative_primal_infeasibility = 0;
  if (value < lower - primal_feasibility_tolerance) {
    // Below lower
    absolute_primal_infeasibility = lower - value;
    relative_primal_infeasibility =
        absolute_primal_infeasibility / (1 + std::fabs(lower));
  } else if (value > upper + primal_feasibility_tolerance) {
    // Above upper
    absolute_primal_infeasibility = value - upper;
    relative_primal_infeasibility =
        absolute_primal_infeasibility / (1 + std::fabs(upper));
  }
  // Account for semi-variables
  if (absolute_primal_infeasibility > 0 &&
      (integrality == HighsVarType::kSemiContinuous ||
       integrality == HighsVarType::kSemiInteger) &&
      std::fabs(value) < primal_feasibility_tolerance) {
    absolute_primal_infeasibility = 0;
    relative_primal_infeasibility = 0;
  }
  value_residual = std::min(std::fabs(lower - value), std::fabs(value - upper));
  // Determine whether the variable is at a bound using the basis
  // status (if valid) or value residual.
  bool at_a_bound = value_residual <= primal_feasibility_tolerance;
  if (status_pointer != NULL) {
    // If the variable is basic, then consider it not to be at a bound
    // so that any dual value yields an infeasibility value
    if (*status_pointer == HighsBasisStatus::kBasic) at_a_bound = false;
    // With very large values, accuracy is lost in adding/subtracting
    // the feasibility tolerance from the bounds, so skip if this may
    // occur
    //
    // Check that kLower and kUpper are consistent with value and
    // bounds - for debugging QP basis errors
    if (*status_pointer == HighsBasisStatus::kLower) {
      if (std::fabs(lower) / primal_feasibility_tolerance < 1e-16)
        status_value_ok = value >= lower - primal_feasibility_tolerance &&
                          value <= lower + primal_feasibility_tolerance;
    } else if (*status_pointer == HighsBasisStatus::kUpper) {
      if (std::fabs(upper) / primal_feasibility_tolerance < 1e-16)
        status_value_ok = value >= upper - primal_feasibility_tolerance &&
                          value <= upper + primal_feasibility_tolerance;
    }
  }
  if (at_a_bound) {
    // At a bound
    double middle = (lower + upper) * 0.5;
    if (lower < upper) {
      // Non-fixed variable
      if (value < middle) {
        // At lower
        dual_infeasibility = std::max(-dual, 0.);
      } else {
        // At upper
        dual_infeasibility = std::max(dual, 0.);
      }
    } else {
      // Fixed variable
      dual_infeasibility = 0;
    }
  } else {
    // Off bounds (or free)
    dual_infeasibility = fabs(dual);
  }
  return status_value_ok;
}